

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

string * __thiscall
cmRST::ReplaceSubstitutions(string *__return_storage_ptr__,cmRST *this,string *line)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  iterator iVar4;
  char *pcVar5;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string substitute;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (char *)0x0;
  while( true ) {
    bVar3 = cmsys::RegularExpression::find
                      (&this->Substitution,pcVar5 + (long)(line->_M_dataplus)._M_p);
    if (!bVar3) break;
    pcVar1 = (this->Substitution).regmatch.searchstring;
    pcVar2 = (this->Substitution).regmatch.endp[2];
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&substitute,&(this->Substitution).regmatch,3);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->Replace)._M_t,&substitute);
    if ((_Rb_tree_header *)iVar4._M_node != &(this->Replace)._M_t._M_impl.super__Rb_tree_header) {
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&this->Replaced,&substitute);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ReplaceSubstitutions(&local_50,this,(string *)(iVar4._M_node + 2));
        std::__cxx11::string::operator=((string *)&substitute,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&this->Replaced,(_Base_ptr)pVar6.first._M_node);
      }
    }
    std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    pcVar5 = pcVar2 + ((long)pcVar5 - (long)pcVar1);
    std::__cxx11::string::~string((string *)&substitute);
  }
  std::__cxx11::string::substr((ulong)&substitute,(ulong)line);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&substitute);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRST::ReplaceSubstitutions(std::string const& line)
{
  std::string out;
  std::string::size_type pos = 0;
  while (this->Substitution.find(line.c_str() + pos)) {
    std::string::size_type start = this->Substitution.start(2);
    std::string::size_type end = this->Substitution.end(2);
    std::string substitute = this->Substitution.match(3);
    auto replace = this->Replace.find(substitute);
    if (replace != this->Replace.end()) {
      std::pair<std::set<std::string>::iterator, bool> replaced =
        this->Replaced.insert(substitute);
      if (replaced.second) {
        substitute = this->ReplaceSubstitutions(replace->second);
        this->Replaced.erase(replaced.first);
      }
    }
    out += line.substr(pos, start);
    out += substitute;
    pos += end;
  }
  out += line.substr(pos);
  return out;
}